

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcpserver.cpp
# Opt level: O2

void __thiscall uv::TCPServer::closeinl(TCPServer *this)

{
  char *pcVar1;
  _Base_ptr p_Var2;
  CStringStream *pCVar3;
  ILog4zManager *pIVar4;
  long *in_FS_OFFSET;
  CStringStream ss;
  
  if (this->isclosed_ == false) {
    uv_mutex_lock(&this->mutex_clients_);
    for (p_Var2 = (this->clients_list_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var2 != &(this->clients_list_)._M_t._M_impl.super__Rb_tree_header;
        p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
      AcceptClient::Close((AcceptClient *)p_Var2[1]._M_parent);
    }
    uv_mutex_unlock(&this->mutex_clients_);
    uv_walk(&this->loop_,CloseWalkCB,this);
    ss.m_pEnd = (char *)*in_FS_OFFSET;
    pcVar1 = ss.m_pEnd + -0x800;
    ss.m_pBegin = pcVar1;
    ss.m_pCur = pcVar1;
    zsummer::log4z::CStringStream::operator<<(&ss,"close server");
    pCVar3 = zsummer::log4z::CStringStream::operator<<(&ss," ( ");
    pCVar3 = zsummer::log4z::CStringStream::operator<<(pCVar3," ");
    pCVar3 = zsummer::log4z::CStringStream::operator<<(pCVar3," ) : ");
    zsummer::log4z::CStringStream::operator<<(pCVar3,0x5c);
    pIVar4 = zsummer::log4z::ILog4zManager::GetInstance();
    (*pIVar4->_vptr_ILog4zManager[8])(pIVar4,0,1,pcVar1);
  }
  return;
}

Assistant:

void TCPServer::closeinl()
{
    if (isclosed_) {
        return;
    }

    uv_mutex_lock(&mutex_clients_);
    for (auto it = clients_list_.begin(); it != clients_list_.end(); ++it) {
        auto data = it->second;
        data->Close();
    }
    uv_mutex_unlock(&mutex_clients_);
    uv_walk(&loop_, CloseWalkCB, this);//close all handle in loop
    LOGI("close server");
}